

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O1

void __thiscall FWadFile::SkinHack(FWadFile *this)

{
  char cVar1;
  FWadFileLump *pFVar2;
  FWadFileLump *pFVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  bool bVar7;
  anon_union_16_3_9144b11c_for_FResourceLump_3 *paVar8;
  ulong uVar9;
  long lVar10;
  
  if ((this->super_FResourceFile).NumLumps != 0) {
    uVar5 = 0;
    bVar7 = false;
    bVar6 = 0;
    iVar4 = SkinHack::namespc;
    do {
      pFVar2 = this->Lumps;
      paVar8 = &pFVar2[uVar5].super_FResourceLump.field_3;
      if ((((paVar8->Name[0] == 'S') && (pFVar2[uVar5].super_FResourceLump.field_3.Name[1] == '_'))
          && (pFVar2[uVar5].super_FResourceLump.field_3.Name[2] == 'S')) &&
         (((pFVar2[uVar5].super_FResourceLump.field_3.Name[3] == 'K' &&
           (pFVar2[uVar5].super_FResourceLump.field_3.Name[4] == 'I')) &&
          ((pFVar2[uVar5].super_FResourceLump.field_3.Name[5] == 'N' &&
           (*(undefined2 *)((long)&pFVar2[uVar5].super_FResourceLump.field_3 + 6) = 0, !bVar7))))))
      {
        uVar9 = (ulong)(this->super_FResourceFile).NumLumps;
        if (uVar9 != 0) {
          pFVar3 = this->Lumps;
          lVar10 = 0;
          do {
            *(int *)((long)&(pFVar3->super_FResourceLump).Namespace + lVar10) = iVar4;
            lVar10 = lVar10 + 0x58;
          } while (uVar9 * 0x58 - lVar10 != 0);
        }
        iVar4 = iVar4 + 1;
        bVar7 = true;
        SkinHack::namespc = iVar4;
      }
      cVar1 = paVar8->Name[0];
      if (cVar1 == 'E') {
        if ((((byte)(pFVar2[uVar5].super_FResourceLump.field_3.Name[1] - 0x30U) < 10) &&
            (pFVar2[uVar5].super_FResourceLump.field_3.Name[2] == 'M')) &&
           ((byte)(pFVar2[uVar5].super_FResourceLump.field_3.Name[3] - 0x30U) < 10)) {
          cVar1 = pFVar2[uVar5].super_FResourceLump.field_3.Name[4];
          goto joined_r0x0060b799;
        }
      }
      else if ((((cVar1 == 'M') && (pFVar2[uVar5].super_FResourceLump.field_3.Name[1] == 'A')) &&
               (pFVar2[uVar5].super_FResourceLump.field_3.Name[2] == 'P')) &&
              (((byte)(pFVar2[uVar5].super_FResourceLump.field_3.Name[3] - 0x30U) < 10 &&
               ((byte)(pFVar2[uVar5].super_FResourceLump.field_3.Name[4] - 0x30U) < 10)))) {
        cVar1 = pFVar2[uVar5].super_FResourceLump.field_3.Name[5];
joined_r0x0060b799:
        if (-1 < cVar1) {
          bVar6 = 1;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_FResourceFile).NumLumps);
    if ((bool)(bVar7 & bVar6)) {
      Printf("\x1cHThe maps in %s will not be loaded because it has a skin.\n\x1cHYou should remove the skin from the wad to play these maps.\n"
             ,(this->super_FResourceFile).Filename);
      return;
    }
  }
  return;
}

Assistant:

void FWadFile::SkinHack ()
{
	static int namespc = ns_firstskin;
	bool skinned = false;
	bool hasmap = false;
	DWORD i;

	for (i = 0; i < NumLumps; i++)
	{
		FResourceLump *lump = &Lumps[i];

		if (lump->Name[0] == 'S' &&
			lump->Name[1] == '_' &&
			lump->Name[2] == 'S' &&
			lump->Name[3] == 'K' &&
			lump->Name[4] == 'I' &&
			lump->Name[5] == 'N')
		{ // Wad has at least one skin.
			lump->Name[6] = lump->Name[7] = 0;
			if (!skinned)
			{
				skinned = true;
				DWORD j;

				for (j = 0; j < NumLumps; j++)
				{
					Lumps[j].Namespace = namespc;
				}
				namespc++;
			}
		}
		if ((lump->Name[0] == 'M' &&
			 lump->Name[1] == 'A' &&
			 lump->Name[2] == 'P' &&
			 lump->Name[3] >= '0' && lump->Name[3] <= '9' &&
			 lump->Name[4] >= '0' && lump->Name[4] <= '9' &&
			 lump->Name[5] >= '\0')
			||
			(lump->Name[0] == 'E' &&
			 lump->Name[1] >= '0' && lump->Name[1] <= '9' &&
			 lump->Name[2] == 'M' &&
			 lump->Name[3] >= '0' && lump->Name[3] <= '9' &&
			 lump->Name[4] >= '\0'))
		{
			hasmap = true;
		}
	}
	if (skinned && hasmap)
	{
		Printf (TEXTCOLOR_BLUE
			"The maps in %s will not be loaded because it has a skin.\n"
			TEXTCOLOR_BLUE
			"You should remove the skin from the wad to play these maps.\n",
			Filename);
	}
}